

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

UnblindOutputStruct *
cfd::js::api::ElementsTransactionStructApi::GetUnblindData
          (UnblindOutputStruct *__return_storage_ptr__,GetUnblindDataRequestStruct *request)

{
  string *in_R8;
  allocator local_169;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  function<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&)>
  local_148;
  UnblindOutputStruct local_128;
  
  UnblindOutputStruct::UnblindOutputStruct(__return_storage_ptr__);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2290:20)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2290:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_148,"GetUnblindData",&local_169);
  ExecuteStructApi<cfd::js::api::GetUnblindDataRequestStruct,cfd::js::api::UnblindOutputStruct>
            (&local_128,(api *)request,(GetUnblindDataRequestStruct *)&local_168,&local_148,in_R8);
  UnblindOutputStruct::operator=(__return_storage_ptr__,&local_128);
  UnblindOutputStruct::~UnblindOutputStruct(&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  return __return_storage_ptr__;
}

Assistant:

UnblindOutputStruct ElementsTransactionStructApi::GetUnblindData(
    const GetUnblindDataRequestStruct& request) {
  auto call_func = [](const GetUnblindDataRequestStruct& request)
      -> UnblindOutputStruct {  // NOLINT
    UnblindOutputStruct response;
    Script locking_script_obj(request.locking_script);
    ConfidentialAssetId asset_obj(request.asset_commitment);
    ConfidentialValue value(request.value_commitment);
    ConfidentialNonce nonce(request.commitment_nonce);
    ByteData rangeproof_obj(request.rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(request.blinding_key)
                                   ? Privkey::FromWif(request.blinding_key)
                                   : Privkey(request.blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    response.amount = unblind_data.value.GetAmount().GetSatoshiValue();
    response.asset = unblind_data.asset.GetHex();
    response.blind_factor = unblind_data.vbf.GetHex();
    response.asset_blind_factor = unblind_data.abf.GetHex();
    return response;
  };

  UnblindOutputStruct result;
  result = ExecuteStructApi<GetUnblindDataRequestStruct, UnblindOutputStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}